

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

bool rtcPointQuery8(int *valid,RTCScene hscene,RTCPointQuery8 *query,
                   RTCPointQueryContext *userContext,RTCPointQueryFunction queryFunc,void **userPtrN
                   )

{
  bool bVar1;
  bool bVar2;
  void *userPtr;
  size_t i;
  long lVar3;
  PointQuery query1;
  
  bVar2 = false;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    if (valid[lVar3] != 0) {
      query1.p.field_0.field_0.x = (float)*(undefined4 *)(query + lVar3 * 4);
      query1.p.field_0.field_0.y = (float)*(undefined4 *)(query + lVar3 * 4 + 0x20);
      query1.p.field_0.field_0.z = (float)*(undefined4 *)(query + lVar3 * 4 + 0x40);
      query1.radius = *(float *)(query + lVar3 * 4 + 0x80);
      query1.time = *(float *)(query + lVar3 * 4 + 0x60);
      if (userPtrN == (void **)0x0) {
        userPtr = (void *)0x0;
      }
      else {
        userPtr = userPtrN[lVar3];
      }
      bVar1 = pointQuery((Scene *)hscene,(RTCPointQuery *)&query1,userContext,queryFunc,userPtr);
      bVar2 = (bool)(bVar2 | bVar1);
      *(float *)(query + lVar3 * 4) = query1.p.field_0.field_0.x;
      *(float *)(query + lVar3 * 4 + 0x20) = query1.p.field_0.field_0.y;
      *(float *)(query + lVar3 * 4 + 0x40) = query1.p.field_0.field_0.z;
      *(float *)(query + lVar3 * 4 + 0x80) = query1.radius;
      *(float *)(query + lVar3 * 4 + 0x60) = query1.time;
    }
  }
  return bVar2;
}

Assistant:

RTC_API bool rtcPointQuery8 (const int* valid, RTCScene hscene, RTCPointQuery8* query, struct RTCPointQueryContext* userContext, RTCPointQueryFunction queryFunc, void** userPtrN)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcPointQuery8);
    
#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    if (scene->isModified()) throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene got not committed");
    if (((size_t)valid) & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "mask not aligned to 16 bytes");   
    if (((size_t)query) & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "query not aligned to 16 bytes");   
#endif
    STAT(size_t cnt=0; for (size_t i=0; i<4; i++) cnt += ((int*)valid)[i] == -1;);
    STAT3(point_query.travs,cnt,cnt,cnt);

    bool changed = false;
    PointQuery8* query8 = (PointQuery8*)query;
    PointQuery query1; 
    for (size_t i=0; i<8; i++) {
      if (!valid[i]) continue;
      query8->get(i,query1);
      changed |= pointQuery(scene, (RTCPointQuery*)&query1, userContext, queryFunc, userPtrN?userPtrN[i]:NULL);
      query8->set(i,query1);
    }
    return changed;
    RTC_CATCH_END2_FALSE(scene);
  }